

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  cmd_ln_t *config;
  char *pcVar6;
  FILE *pFVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  ps_decoder_t *ps;
  void *ptr;
  char **ppcVar11;
  ulong uVar12;
  uint uVar13;
  code *func;
  ulong uVar14;
  char *pcVar15;
  char **inputs;
  
  inputs = (char **)0x0;
  if (argc < 2) {
    pcVar15 = "live";
LAB_001079af:
    iVar2 = strcmp(pcVar15,"soxflags");
    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar15,"config"), iVar2 == 0)) {
      uVar14 = 0;
    }
    else {
      iVar2 = strcmp(pcVar15,"help-config");
      uVar14 = 0;
      if (iVar2 != 0) goto LAB_00107d18;
    }
  }
  else {
    lVar5 = 0;
    do {
      pcVar15 = argv[lVar5 + 1];
      iVar2 = (int)lVar5;
      if (((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) && (*pcVar15 != '-')) {
        memmove(argv + lVar5 + 1,argv + lVar5 + 2,(long)((argc - iVar2) + -2) << 3);
        argc = argc + -1;
        goto LAB_00107901;
      }
      lVar5 = lVar5 + 2;
    } while (iVar2 + 3 < argc);
    pcVar15 = "live";
LAB_00107901:
    uVar14 = 0;
    if (argc < 2) {
      inputs = (char **)0x0;
      goto LAB_001079af;
    }
    uVar13 = 1;
    inputs = (char **)0x0;
    iVar2 = argc;
    do {
      pcVar6 = argv[(int)uVar13];
      if (((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) ||
         ((*pcVar6 == '-' && (pcVar6[1] != '\0')))) {
        uVar13 = uVar13 + 2;
      }
      else {
        memmove(argv + (int)uVar13,argv + (int)uVar13 + 1,(long)(int)(iVar2 + ~uVar13) << 3);
        iVar2 = argc + -1;
        inputs = argv + (long)argc + -1;
        *inputs = pcVar6;
        uVar14 = (ulong)((int)uVar14 + 1);
        argc = iVar2;
      }
    } while ((int)uVar13 < iVar2);
    if (1 < (int)uVar14) {
      ppcVar11 = inputs + uVar14;
      uVar12 = 0;
      do {
        ppcVar11 = ppcVar11 + -1;
        pcVar6 = inputs[uVar12];
        inputs[uVar12] = *ppcVar11;
        *ppcVar11 = pcVar6;
        uVar12 = uVar12 + 1;
      } while (uVar14 >> 1 != uVar12);
    }
    if ((int)uVar14 == 0) goto LAB_001079af;
  }
  config = cmd_ln_parse_r((ps_config_t *)0x0,ps_main_args_def,argc,argv,0);
  if (config == (cmd_ln_t *)0x0) {
LAB_00107d18:
    usage(*argv,0);
    return 1;
  }
  ps_default_search_args(config);
  iVar2 = ps_config_bool(config,"state_align");
  if (iVar2 != 0) {
    ps_config_set_bool(config,"phone_align",1);
  }
  pcVar6 = ps_config_str(config,"config");
  if (pcVar6 != (char *)0x0) {
    pFVar7 = fopen(pcVar6,"rt");
    if (pFVar7 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                     ,0x305,"Failed to open config file %s",pcVar6);
      return 1;
    }
    fseek(pFVar7,0,2);
    sVar8 = ftell(pFVar7);
    fseek(pFVar7,0,0);
    pcVar9 = (char *)__ckd_malloc__(sVar8 + 1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                    ,0x30b);
    sVar10 = fread(pcVar9,1,sVar8,pFVar7);
    if (sVar10 != sVar8) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                     ,0x30d,"Failed to read config file %s",pcVar6);
      ckd_free(pcVar9);
      fclose(pFVar7);
      return 1;
    }
    pcVar9[sVar8] = '\0';
    fclose(pFVar7);
    config = ps_config_parse_json(config,pcVar9);
    ckd_free(pcVar9);
    if (config == (ps_config_t *)0x0) {
      return 1;
    }
    ps_config_set_str(config,"config",(char *)0x0);
  }
  iVar2 = strcmp(pcVar15,"soxflags");
  if (iVar2 == 0) {
    ps_expand_model_config(config);
    uVar14 = ps_config_int(config,"samprate");
    iVar2 = snprintf((char *)0x0,0,"-r %d -c 1 -b 16 -e signed-integer -t raw -",uVar14 & 0xffffffff
                    );
    if (-1 < iVar2) {
      pcVar15 = (char *)__ckd_calloc__((ulong)(iVar2 + 1),1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                       ,0x264);
      iVar4 = 0;
      iVar3 = snprintf(pcVar15,(ulong)(iVar2 + 1),"-r %d -c 1 -b 16 -e signed-integer -t raw -",
                       uVar14 & 0xffffffff);
      if (iVar3 == iVar2) {
        puts(pcVar15);
        fflush(_stdout);
        ckd_free(pcVar15);
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                       ,0x267,"Failed to snprintf()");
        iVar4 = -1;
      }
      goto LAB_00107d9b;
    }
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                   ,0x260,"Failed to snprintf()");
  }
  else {
    iVar2 = strcmp(pcVar15,"config");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar15,"live");
      iVar3 = (int)uVar14;
      if (iVar2 == 0) {
        func = live;
      }
      else {
        iVar2 = strcmp(pcVar15,"single");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar15,"align");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar15,"help");
            if (iVar2 == 0) {
              iVar4 = 0;
              usage(*argv,0);
              goto LAB_00107d9b;
            }
            iVar2 = strcmp(pcVar15,"help-config");
            if (iVar2 != 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                      ,0x32d,"Unknown command \"%s\"\n",pcVar15);
              return 1;
            }
            usage(*argv,1);
            goto LAB_00107d11;
          }
          if (1 < iVar3) {
            ps_config_set_bool(config,"bestpath",0);
            ps_config_set_str(config,"lm",(char *)0x0);
            pcVar15 = *inputs;
            if ((*pcVar15 == '-') && (pcVar15[1] == '\0')) {
              bVar1 = true;
              pFVar7 = _stdin;
            }
            else {
              pFVar7 = fopen(pcVar15,"rb");
              iVar4 = 0;
              pcVar15 = *inputs;
              if (pFVar7 == (FILE *)0x0) {
                err_msg_system(ERR_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                               ,0x21e,"Failed to open %s for input");
                goto LAB_00107d9b;
              }
              bVar1 = false;
            }
            iVar4 = ps_config_soundfile(config,(FILE *)pFVar7,pcVar15);
            if (iVar4 < 0) {
              ps = (ps_decoder_t *)0x0;
              pcVar15 = (char *)0x0;
            }
            else {
              ps = ps_init(config);
              if (ps == (ps_decoder_t *)0x0) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                        ,0x224,"PocketSphinx decoder init failed\n");
                exit(1);
              }
              uVar14 = (ulong)(iVar3 - 1);
              ptr = __ckd_malloc__(uVar14 * 4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                   ,0x1fa);
              uVar12 = 0;
              iVar2 = 0;
              do {
                sVar8 = strlen(inputs[uVar12 + 1]);
                *(int *)((long)ptr + uVar12 * 4) = (int)sVar8;
                iVar2 = iVar2 + (int)sVar8 + 1;
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
              pcVar15 = (char *)__ckd_malloc__((long)iVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                               ,0x1ff);
              uVar12 = 0;
              pcVar6 = pcVar15;
              do {
                pcVar9 = pcVar6;
                memcpy(pcVar9,inputs[uVar12 + 1],(long)*(int *)((long)ptr + uVar12 * 4));
                iVar2 = *(int *)((long)ptr + uVar12 * 4);
                pcVar9[iVar2] = ' ';
                uVar12 = uVar12 + 1;
                pcVar6 = pcVar9 + iVar2 + 1;
              } while (uVar14 != uVar12);
              pcVar9[iVar2] = '\0';
              ckd_free(ptr);
              iVar4 = ps_set_align_text(ps,pcVar15);
              if (-1 < iVar4) {
                iVar4 = decode_single(ps,(FILE *)pFVar7);
              }
            }
            if (!bVar1 && pFVar7 != (FILE *)0x0) {
              fclose(pFVar7);
            }
            if (pcVar15 != (char *)0x0) {
              ckd_free(pcVar15);
            }
            if (ps != (ps_decoder_t *)0x0) {
              ps_free(ps);
            }
            goto LAB_00107d9b;
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                  ,0x213,"Usage: pocketsphinx align INFILE TEXT...\n");
          goto LAB_00107d52;
        }
        func = single;
      }
      iVar4 = process_inputs(func,config,inputs,iVar3);
      goto LAB_00107d9b;
    }
    pcVar15 = ps_config_serialize_json(config);
    iVar2 = puts(pcVar15);
    if (-1 < iVar2) {
      fflush(_stdout);
LAB_00107d11:
      iVar4 = 0;
      goto LAB_00107d9b;
    }
  }
LAB_00107d52:
  iVar4 = -1;
LAB_00107d9b:
  ps_config_free(config);
  return iVar4;
}

Assistant:

int
main(int argc, char *argv[])
{
    ps_config_t *config;
    const char *conffile;
    char *command;
    char **inputs;
    int rv, ninputs;

    command = find_command(&argc, argv);
    inputs = find_inputs(&argc, argv, &ninputs);
    /* Only soxflags and config take no arguments */
    if (ninputs == 0) {
        if ((0 != strcmp(command, "soxflags"))
            && 0 != strcmp(command, "config")
            && 0 != strcmp(command, "help-config")) {
            usage(argv[0], FALSE);
            return 1;
        }
    }
    /* If arg parsing fails */
    if ((config = ps_config_parse_args(ps_main_args_def, argc, argv)) == NULL) {
        usage(argv[0], FALSE);
        return 1;
    }
    ps_default_search_args(config);
    if (ps_config_bool(config, "state_align"))
        ps_config_set_bool(config, "phone_align", TRUE);
    if ((conffile = ps_config_str(config, "config")) != NULL) {
        char *json;
        FILE *infh;
        size_t len;
        if ((infh = fopen(conffile, "rt")) == NULL) {
            E_ERROR_SYSTEM("Failed to open config file %s", conffile);
            return 1;
        }
        fseek(infh, 0, SEEK_END);
        len = (size_t)ftell(infh);
        fseek(infh, 0, SEEK_SET);
        json = ckd_malloc(len + 1);
        if (fread(json, 1, len, infh) != len) {
            E_ERROR_SYSTEM("Failed to read config file %s", conffile);
            ckd_free(json);
            fclose(infh);
            return 1;
        }
        json[len] = '\0';
        fclose(infh);
        config = ps_config_parse_json(config, json);
        ckd_free(json);
        if (config == NULL)
            return 1;
        ps_config_set_str(config, "config", NULL);
    }
    if (0 == strcmp(command, "soxflags"))
        rv = soxflags(config);
    else if (0 == strcmp(command, "config"))
        rv = print_config(config);
    else if (0 == strcmp(command, "live"))
        rv = process_inputs(live, config, inputs, ninputs);
    else if (0 == strcmp(command, "single"))
        rv = process_inputs(single, config, inputs, ninputs);
    else if (0 == strcmp(command, "align"))
        rv = align(config, inputs, ninputs);
    else if (0 == strcmp(command, "help")) {
        rv = 0;
        usage(argv[0], FALSE);
    }
    else if (0 == strcmp(command, "help-config")) {
        rv = 0;
        usage(argv[0], TRUE);
    }
    else {
        E_ERROR("Unknown command \"%s\"\n", command);
        return 1;
    }

    ps_config_free(config);
    return rv;
}